

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::receiveIncomingMessage(ConnectionImpl *this)

{
  Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *this_00;
  int *piVar1;
  ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *this_01;
  PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
  *__return_storage_ptr__;
  long *plVar2;
  _List_node_base *node;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> coroutine;
  long in_RSI;
  Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> MVar4;
  Exception local_1c0;
  
  coroutine._M_fr_ptr = operator_new(0x458);
  *(code **)coroutine._M_fr_ptr = receiveIncomingMessage;
  *(code **)((long)coroutine._M_fr_ptr + 8) = receiveIncomingMessage;
  this_00 = (Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
            ((long)coroutine._M_fr_ptr + 0x10);
  *(long *)((long)coroutine._M_fr_ptr + 0x448) = in_RSI;
  local_1c0.ownFile.content.ptr =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  local_1c0.ownFile.content.size_ = 0x52b0ff;
  local_1c0.ownFile.content.disposer = (ArrayDisposer *)0x39000001ab;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006e67f0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006e6838;
  location.function = "receiveIncomingMessage";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  location.lineNumber = 0x1ab;
  location.columnNumber = 0x39;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006e67f0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006e6838;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_Connection).super_Connection._vptr_Connection = (_func_int **)this_00;
  if (*(char *)(in_RSI + 0x108) != '\0') {
    kj::Exception::Exception(&local_1c0,(Exception *)(in_RSI + 0x110));
    kj::throwFatalException(&local_1c0,0);
  }
  if (*(char *)(in_RSI + 0x2e1) == '\x01') {
    (((FixVoid<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)
     ((long)coroutine._M_fr_ptr + 0x410))->ptr).disposer = (Disposer *)0x0;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x418) = 0;
    kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::fulfill
              (this_00,(FixVoid<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)
                       ((long)coroutine._M_fr_ptr + 0x410));
    plVar2 = *(long **)((long)coroutine._M_fr_ptr + 0x418);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x418) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x410))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x410),
                 (long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
  }
  else {
    this_01 = (ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
               *)((long)coroutine._M_fr_ptr + 0x440);
    kj::ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::pop
              (this_01);
    __return_storage_ptr__ =
         (PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
         ((long)coroutine._M_fr_ptr + 0x248);
    co_await<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>>
              (__return_storage_ptr__,
               (Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)this_01);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x450) = 0;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar3) {
      return (PromiseBase)(PromiseBase)this;
    }
    MVar4 = kj::_::PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
            await_resume((PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
                          *)((long)coroutine._M_fr_ptr + 0x420));
    if ((*(char *)((long)coroutine._M_fr_ptr + 0x3f8) == '\x01') &&
       (plVar2 = *(long **)((long)coroutine._M_fr_ptr + 0x408), plVar2 != (long *)0x0)) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x408) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x400))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x400),
                 (long)plVar2 + *(long *)(*plVar2 + -0x10),MVar4.ptr.ptr);
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x260) == '\x01') {
      kj::Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x268));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = (this_01->values).
           super__List_base<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>,_std::allocator<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
    if (node != (_List_node_base *)0x0) {
      (this_01->values).
      super__List_base<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>,_std::allocator<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
    if (*(long *)((long)coroutine._M_fr_ptr + 0x428) == 0) {
      plVar2 = *(long **)(*(long *)((long)coroutine._M_fr_ptr + 0x448) + 0x2d8);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x10))(plVar2,&local_1c0);
      }
    }
    else {
      piVar1 = (int *)(*(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x448) + 0x20) + 0x24);
      *piVar1 = *piVar1 + 1;
    }
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x430) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x420);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x438) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x428);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x428) = 0;
    kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::fulfill
              (this_00,(FixVoid<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)
                       ((long)coroutine._M_fr_ptr + 0x430));
    plVar2 = *(long **)((long)coroutine._M_fr_ptr + 0x438);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x438) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x430))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x430),
                 (long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = *(long **)((long)coroutine._M_fr_ptr + 0x428);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x428) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x420))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x420),
                 (long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
  }
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x450) = 1;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> receiveIncomingMessage() override {
      KJ_IF_SOME(e, networkException) {
        kj::throwFatalException(kj::cp(e));
      }

      if (initiatedIdleShutdown) {
        co_return kj::none;
      }

      auto result = co_await messageQueue.pop();

      if (result == kj::none) {
        KJ_IF_SOME(f, fulfillOnEnd) {
          f->fulfill();
        }
      } else {
        ++vat.received;
      }

      co_return result;
    }